

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void speech_prog_ice_dragon_statue(OBJ_DATA *obj,CHAR_DATA *ch,char *speech)

{
  bool bVar1;
  CHAR_DATA *arg1;
  CHAR_DATA *in_RDX;
  CHAR_DATA *in_RSI;
  OBJ_DATA *in_RDI;
  __type_conflict2 _Var2;
  OBJ_DATA *unaff_retaddr;
  CHAR_DATA *dragon;
  CHAR_DATA *in_stack_00000058;
  CHAR_DATA *in_stack_00000060;
  MOB_INDEX_DATA *in_stack_000000b0;
  int in_stack_00000204;
  CHAR_DATA *in_stack_00000208;
  CHAR_DATA *in_stack_00000210;
  char *in_stack_00001360;
  CHAR_DATA *in_stack_00001368;
  void *in_stack_ffffffffffffffd8;
  
  bVar1 = str_cmp((char *)in_RDX,"Valnian");
  if (!bVar1) {
    get_mob_index((int)((ulong)in_RDX >> 0x20));
    arg1 = create_mobile(in_stack_000000b0);
    if ((arg1 != (CHAR_DATA *)0x0) && (bVar1 = is_worn(in_RDI), bVar1)) {
      char_to_room((CHAR_DATA *)speech,(ROOM_INDEX_DATA *)dragon);
      if (in_RSI->level < 0x28) {
        do_say(in_stack_00001368,in_stack_00001360);
        multi_hit(in_stack_00000210,in_stack_00000208,in_stack_00000204);
        extract_obj(unaff_retaddr);
      }
      else {
        act((char *)in_RSI,in_RDX,arg1,in_stack_ffffffffffffffd8,0);
        add_follower(in_stack_00000060,in_stack_00000058);
        arg1->leader = in_RSI;
        _Var2 = std::pow<int,int>(0,0x665dc2);
        arg1->affected_by[0] = (long)_Var2 | arg1->affected_by[0];
        extract_obj(unaff_retaddr);
      }
    }
  }
  return;
}

Assistant:

void speech_prog_ice_dragon_statue(OBJ_DATA *obj, CHAR_DATA *ch, char *speech)
{
	CHAR_DATA *dragon;
	if (str_cmp(speech, "Valnian"))
		return;

	dragon = create_mobile(get_mob_index(1617));

	if (!dragon || !is_worn(obj))
		return;

	char_to_room(dragon, ch->in_room);

	if (ch->level < 40)
	{
		do_say(dragon, "You dare to call upon me, weakling?!");
		multi_hit(dragon, ch, TYPE_UNDEFINED);
		extract_obj(obj);

		return;
	}

	act("$p shatters violently in a cloud of ice. As it clears, a dragon of pure ice hovers over you.", dragon, obj, 0, TO_ROOM);
	add_follower(dragon, ch);

	dragon->leader = ch;

	SET_BIT(dragon->affected_by, AFF_CHARM);

	extract_obj(obj);
}